

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_get_nearest(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_doc *doc,
               fdb_get_nearest_opt_t opt)

{
  long lVar1;
  docio_length len;
  void *pvVar2;
  fdb_custom_cmp_variable p_Var3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  reference pvVar7;
  int64_t iVar8;
  size_t sVar9;
  undefined8 *puVar10;
  void *pvVar11;
  long *in_FS_OFFSET;
  undefined8 uStackY_200;
  undefined1 auStackY_1f8 [6];
  uint8_t in_stack_fffffffffffffe0e;
  uint8_t in_stack_fffffffffffffe0f;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  size_t local_1e8 [2];
  void *local_1d8;
  size_t local_1d0;
  fdb_custom_cmp_variable local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  void *local_1b0;
  size_t local_1a8;
  fdb_custom_cmp_variable local_1a0;
  allocator<char> *local_198;
  undefined8 local_190;
  ulong local_180;
  size_t size_chunk_1;
  fdb_kvs_id_t kv_id;
  int cmp_1;
  int cmp;
  size_t ret_keylen;
  allocator<char> local_149 [9];
  hbtrie_iterator hit;
  size_t sStack_a8;
  int size_chunk;
  size_t doc_keylen;
  void *doc_key;
  fdb_txn *txn;
  hbtrie_result hr;
  docio_handle *dhandle;
  docio_object _doc;
  int64_t _offset;
  uint64_t offset;
  fdb_get_nearest_opt_t opt_local;
  fdb_doc *doc_local;
  size_t keylen_local;
  void *key_local;
  fdb_kvs_handle *handle_local;
  
  puVar10 = (undefined8 *)auStackY_1f8;
  uStackY_200 = 0x13c44a;
  docio_object::docio_object
            ((docio_object *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if (((handle->config).do_not_search_wal & 1U) == 0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_CONFIG;
  }
  else if (((((doc == (fdb_doc *)0x0) || (key == (void *)0x0)) || (keylen == 0)) ||
           (0xff80 < keylen)) ||
          (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0 &&
           ((handle->config).blocksize - 0x100 < keylen)))) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else {
    uStackY_200 = 0x13c4e5;
    bVar5 = atomic_cas_uint8_t((atomic<unsigned_char> *)
                               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                               in_stack_fffffffffffffe0f,in_stack_fffffffffffffe0e);
    if (bVar5) {
      sStack_a8 = keylen;
      doc_keylen = (size_t)key;
      if (handle->kvs != (kvs_info *)0x0) {
        hit._148_4_ = ZEXT24((handle->config).chunksize);
        sStack_a8 = keylen + (long)(int)hit._148_4_;
        lVar1 = -(sStack_a8 + 0xf & 0xfffffffffffffff0);
        puVar10 = (undefined8 *)(auStackY_1f8 + lVar1);
        *(undefined8 *)(auStackY_1f8 + lVar1 + -8) = 0x13c577;
        kvid2buf(*(size_t *)((long)local_1e8 + lVar1 + 8),*(fdb_kvs_id_t *)((long)local_1e8 + lVar1)
                 ,*(void **)(&stack0xfffffffffffffe10 + lVar1));
        lVar6 = (long)(int)hit._148_4_;
        *(undefined8 *)(auStackY_1f8 + lVar1 + -8) = 0x13c595;
        memcpy((undefined1 *)((long)puVar10 + lVar6),key,keylen);
        doc_keylen = (size_t)puVar10;
      }
      if (handle->shandle == (snap_handle *)0x0) {
        puVar10[-1] = 0x13c5b0;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
      }
      if (handle->shandle == (snap_handle *)0x0) {
        puVar10[-1] = 0x13c623;
        fdb_sync_db_header((fdb_kvs_handle *)puVar10[0x16]);
      }
      puVar10[-1] = 0x13c636;
      atomic_incr_uint64_t((atomic<unsigned_long> *)puVar10[1],*(memory_order *)((long)puVar10 + 4))
      ;
      puVar10[-1] = 0x13c63f;
      _fdb_sync_dirty_root((fdb_kvs_handle *)puVar10[3]);
      if ((char)in_FS_OFFSET[-0xf] == '\0') {
        local_198 = local_149;
        puVar10[-1] = 0x13c65e;
        std::allocator<char>::allocator();
        puVar10[-1] = 0x13c67f;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar10[5],puVar10[4],
                   (allocator_type *)puVar10[3]);
        puVar10[-1] = 0x13c68d;
        std::allocator<char>::~allocator(local_149);
        lVar1 = *in_FS_OFFSET;
        puVar10[-1] = 0x13c6b0;
        __cxa_thread_atexit(std::vector<char,_std::allocator<char>_>::~vector,lVar1 + -0x90,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -0xf) = 1;
      }
      _cmp_1 = 0;
      puVar10[-1] = 0x13c6e6;
      txn._4_4_ = hbtrie_iterator_init
                            ((hbtrie *)puVar10[2],(hbtrie_iterator *)puVar10[1],(void *)*puVar10,
                             puVar10[-1]);
      if (txn._4_4_ == HBTRIE_RESULT_SUCCESS) {
        if ((opt == '\0') || (opt == '\x01')) {
          do {
            lVar1 = *in_FS_OFFSET;
            puVar10[-1] = 0x13c72a;
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
            puVar10[-1] = 0x13c744;
            txn._4_4_ = hbtrie_next((hbtrie_iterator *)puVar10[6],(void *)puVar10[5],
                                    (size_t *)puVar10[4],(void *)puVar10[3]);
            kv_id._4_4_ = 0;
            if ((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
              local_1c0 = doc_keylen;
              local_1b8 = sStack_a8;
              lVar1 = *in_FS_OFFSET;
              puVar10[-1] = 0x13c830;
              std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
              puVar10[-1] = 0x13c84d;
              kv_id._4_4_ = _lex_keycmp((void *)puVar10[6],puVar10[5],(void *)puVar10[4],puVar10[3])
              ;
            }
            else {
              local_1a0 = (handle->kvs_config).custom_cmp;
              local_1b0 = (void *)doc_keylen;
              local_1a8 = sStack_a8;
              lVar1 = *in_FS_OFFSET;
              puVar10[-1] = 0x13c7a7;
              pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
              sVar4 = _cmp_1;
              p_Var3 = local_1a0;
              sVar9 = local_1a8;
              pvVar2 = local_1b0;
              pvVar11 = (handle->kvs_config).custom_cmp_param;
              puVar10[-1] = 0x13c7d0;
              kv_id._4_4_ = (*p_Var3)(pvVar2,sVar9,pvVar7,sVar4,pvVar11);
            }
          } while ((((opt != '\0') || (0 < kv_id._4_4_)) && ((opt != '\x01' || (-1 < kv_id._4_4_))))
                  && (txn._4_4_ == HBTRIE_RESULT_SUCCESS));
        }
        else {
          do {
            lVar1 = *in_FS_OFFSET;
            puVar10[-1] = 0x13c8aa;
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
            puVar10[-1] = 0x13c8c4;
            txn._4_4_ = hbtrie_prev((hbtrie_iterator *)puVar10[6],(void *)puVar10[5],
                                    (size_t *)puVar10[4],(void *)puVar10[3]);
            kv_id._0_4_ = 0;
            if ((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
              local_1e8[0] = doc_keylen;
              local_1e8[1] = sStack_a8;
              lVar1 = *in_FS_OFFSET;
              puVar10[-1] = 0x13c989;
              std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
              puVar10[-1] = 0x13c9a6;
              kv_id._0_4_ = _lex_keycmp((void *)puVar10[6],puVar10[5],(void *)puVar10[4],puVar10[3])
              ;
            }
            else {
              local_1c8 = (handle->kvs_config).custom_cmp;
              local_1d8 = (void *)doc_keylen;
              local_1d0 = sStack_a8;
              lVar1 = *in_FS_OFFSET;
              puVar10[-1] = 0x13c923;
              pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)(lVar1 + -0x90),0);
              sVar4 = _cmp_1;
              p_Var3 = local_1c8;
              sVar9 = local_1d0;
              pvVar2 = local_1d8;
              pvVar11 = (handle->kvs_config).custom_cmp_param;
              puVar10[-1] = 0x13c94c;
              kv_id._0_4_ = (*p_Var3)(pvVar2,sVar9,pvVar7,sVar4,pvVar11);
            }
          } while ((((opt != '\x02') || ((int)kv_id < 0)) && ((opt != '\x03' || ((int)kv_id < 1))))
                  && (txn._4_4_ == HBTRIE_RESULT_SUCCESS));
        }
        puVar10[-1] = 0x13c9f1;
        hbtrie_iterator_free((hbtrie_iterator *)puVar10[1]);
      }
      puVar10[-1] = 0x13c9fe;
      btreeblk_end((btreeblk_handle *)puVar10[2]);
      puVar10[-1] = 0x13caa7;
      _fdb_release_dirty_root((fdb_kvs_handle *)puVar10[1]);
      if (txn._4_4_ == HBTRIE_RESULT_SUCCESS) {
        puVar10[-1] = 0x13caca;
        iVar8 = docio_read_doc((docio_handle *)puVar10[0x24],puVar10[0x23],
                               (docio_object *)puVar10[0x22],*(bool *)((long)puVar10 + 0x10f));
        if (iVar8 < 1) {
          puVar10[-1] = 0x13caec;
          atomic_cas_uint8_t((atomic<unsigned_char> *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                             *(uint8_t *)((long)puVar10 + 6));
          if (iVar8 < 0) {
            handle_local._4_4_ = (fdb_status)iVar8;
          }
          else {
            handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
        else if ((_doc.length.bodylen & 4) == 0) {
          if (handle->kvs != (kvs_info *)0x0) {
            local_180 = (ulong)(handle->config).chunksize;
            puVar10[-1] = 0x13cb90;
            buf2kvid(puVar10[3],(void *)puVar10[2],(fdb_kvs_id_t *)puVar10[1]);
            if (size_chunk_1 != handle->kvs->id) {
              puVar10[-1] = 0x13cbbc;
              atomic_cas_uint8_t((atomic<unsigned_char> *)puVar10[1],*(uint8_t *)((long)puVar10 + 7)
                                 ,*(uint8_t *)((long)puVar10 + 6));
              puVar10[-1] = 0x13cbce;
              free_docio_object((docio_object *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                                *(uint8_t *)((long)puVar10 + 6),*(uint8_t *)((long)puVar10 + 5));
              return FDB_RESULT_KEY_NOT_FOUND;
            }
            dhandle._0_2_ = (ushort)dhandle - (short)local_180;
            pvVar11 = (void *)(_doc._16_8_ + local_180);
            puVar10[-1] = 0x13cc06;
            memmove((void *)_doc._16_8_,pvVar11,(ulong)(ushort)dhandle);
          }
          doc->key = (void *)_doc._16_8_;
          doc->keylen = (ulong)(ushort)dhandle;
          doc->seqnum = (fdb_seqnum_t)_doc.key;
          doc->metalen = (ulong)dhandle._2_2_;
          doc->bodylen = (ulong)dhandle._4_4_;
          doc->meta = (void *)_doc.field_3;
          doc->body = _doc.meta;
          doc->deleted = (_doc.length.bodylen & 4) != 0;
          local_190 = CONCAT44(dhandle._4_4_,CONCAT22(dhandle._2_2_,(ushort)dhandle));
          len._12_4_ = _doc.length.bodylen;
          len.bodylen_ondisk = _doc.length._0_4_;
          len.keylen = (ushort)dhandle;
          len.metalen = dhandle._2_2_;
          len.bodylen = dhandle._4_4_;
          puVar10[-1] = 0x13cc9e;
          sVar9 = _fdb_get_docsize(len);
          doc->size_ondisk = sVar9;
          doc->offset = (ulong)_offset >> 0x38 | (_offset & 0xff000000000000U) >> 0x28 |
                        (_offset & 0xff0000000000U) >> 0x18 | (_offset & 0xff00000000U) >> 8 |
                        (_offset & 0xff000000U) << 8 | (_offset & 0xff0000U) << 0x18 |
                        (_offset & 0xff00U) << 0x28 | _offset << 0x38;
          puVar10[-1] = 0x13cccc;
          atomic_cas_uint8_t((atomic<unsigned_char> *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                             *(uint8_t *)((long)puVar10 + 6));
          handle_local._4_4_ = FDB_RESULT_SUCCESS;
        }
        else {
          puVar10[-1] = 0x13cb38;
          free_docio_object((docio_object *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                            *(uint8_t *)((long)puVar10 + 6),*(uint8_t *)((long)puVar10 + 5));
          puVar10[-1] = 0x13cb4f;
          atomic_cas_uint8_t((atomic<unsigned_char> *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                             *(uint8_t *)((long)puVar10 + 6));
          handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
        }
      }
      else {
        puVar10[-1] = 0x13ccec;
        atomic_cas_uint8_t((atomic<unsigned_char> *)puVar10[1],*(uint8_t *)((long)puVar10 + 7),
                           *(uint8_t *)((long)puVar10 + 6));
        handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_nearest(fdb_kvs_handle *handle,
                           const void *key,
                           size_t keylen,
                           fdb_doc *doc,
                           fdb_get_nearest_opt_t opt)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!doc || !key || keylen == 0 ||
        keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    dhandle = handle->dhandle;

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    _fdb_sync_dirty_root(handle);

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    size_t ret_keylen = 0;

    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        // NOTE: Due to HB-trie's suffix skip, may need to call prev/next
        //       multiple times.
        if (opt == FDB_GET_GREATER_OR_EQUAL || opt == FDB_GET_GREATER) {
            do {
                hr = hbtrie_next(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_GREATER_OR_EQUAL && cmp <= 0) break;
                if (opt == FDB_GET_GREATER && cmp < 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);

        } else {
            do {
                hr = hbtrie_prev(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_SMALLER_OR_EQUAL && cmp >= 0) break;
                if (opt == FDB_GET_SMALLER && cmp > 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);
        }
        hbtrie_iterator_free(&hit);
    }
    btreeblk_end(handle->bhandle);
    offset = _endian_decode(offset);

    _fdb_release_dirty_root(handle);

    if (hr == HBTRIE_RESULT_SUCCESS) {
        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 1, 1, 1);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        if (handle->kvs) {
            fdb_kvs_id_t kv_id;
            size_t size_chunk = handle->config.chunksize;
            buf2kvid(size_chunk, _doc.key, &kv_id);
            if (kv_id != handle->kvs->id) {
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                free_docio_object(&_doc, 1, 1, 1);
                return FDB_RESULT_KEY_NOT_FOUND;
            }
            _doc.length.keylen -= size_chunk;
            memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
        }
        doc->key = _doc.key;
        doc->keylen = _doc.length.keylen;

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}